

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O3

word Z80::GetWordNoMem(char **p)

{
  char *badValueMessage;
  int iVar1;
  EStatus type;
  word wVar2;
  char *message;
  aint val;
  aint local_c;
  
  badValueMessage = lp;
  if (DAT_0018e518 == 0) {
    iVar1 = ParseExpression(&lp,&local_c);
    if (iVar1 == 0) {
      wVar2 = 0;
      Error("Operand expected",(char *)0x0,IF_FIRST);
    }
    else {
      check16(local_c);
      wVar2 = (word)local_c;
    }
    return wVar2;
  }
  iVar1 = ParseExpressionMemAccess(&lp,&local_c);
  if (iVar1 == 2) {
    message = "Illegal instruction (can\'t access memory)";
    type = PASS3;
  }
  else {
    if (iVar1 == 1) {
      check16(local_c);
      return (word)local_c;
    }
    message = "Operand expected";
    type = IF_FIRST;
  }
  Error(message,badValueMessage,type);
  return 0;
}

Assistant:

static word GetWordNoMem(char*& p) {
		if (0 == Options::syx.MemoryBrackets) return GetWord(p); // legacy behaviour => don't care
		aint val; char* const oldP = p;
		switch (ParseExpressionMemAccess(p, val)) {
		case 1:					// valid constant (not a memory access) => return value
			check16(val);
			return val & 65535;
		case 2:					// valid memory access => report error
			Error("Illegal instruction (can't access memory)", oldP);
			return 0;
		default:				// parsing failed, report syntax error
			Error("Operand expected", oldP, IF_FIRST);
			return 0;
		}
	}